

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::FBXImporter::InternReadFile
          (FBXImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  _Rb_tree_header *p_Var1;
  pointer input;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  float fVar5;
  TokenList tokens;
  vector<char,_std::allocator<char>_> contents;
  Parser parser;
  Document doc;
  TokenList local_1e8;
  vector<char,_std::allocator<char>_> local_1c8;
  Parser local_1b0;
  Document local_180;
  long *plVar3;
  
  p_Var1 = &local_180.objects._M_t._M_impl.super__Rb_tree_header;
  local_180.settings = (ImportSettings *)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"rb","");
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_180.settings);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if ((_Rb_tree_header *)local_180.settings != p_Var1) {
    operator_delete(local_180.settings);
  }
  if (plVar3 == (long *)0x0) {
    local_180.settings = (ImportSettings *)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"Could not open file for reading","");
    LogFunctions<Assimp::FBXImporter>::ThrowException((string *)&local_180);
    if ((_Rb_tree_header *)local_180.settings != p_Var1) {
      operator_delete(local_180.settings);
    }
  }
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar4 = (**(code **)(*plVar3 + 0x30))(plVar3);
  std::vector<char,_std::allocator<char>_>::resize(&local_1c8,lVar4 + 1);
  (**(code **)(*plVar3 + 0x10))
            (plVar3,local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,1,
             local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             ~(ulong)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  input = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish[-1] = '\0';
  local_1e8.
  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = strncmp(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,"Kaydara FBX Binary",0x12);
  if (iVar2 == 0) {
    FBX::TokenizeBinary(&local_1e8,input,
                        (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)input);
  }
  else {
    FBX::Tokenize(&local_1e8,input);
  }
  FBX::Parser::Parser(&local_1b0,&local_1e8,iVar2 == 0);
  FBX::Document::Document(&local_180,&local_1b0,&this->settings);
  FBX::ConvertToAssimpScene(pScene,&local_180,(this->settings).removeEmptyBones);
  if ((tuple<Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
       )local_180.globals._M_t.
        super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
        .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl !=
      (_Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>)0x0) {
    fVar5 = FBX::FileGlobalSettings::UnitScaleFactor
                      ((FileGlobalSettings *)
                       local_180.globals._M_t.
                       super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                       .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl
                      );
    (*(this->super_BaseImporter)._vptr_BaseImporter[6])(SUB84((double)(fVar5 * 0.01),0),this);
    std::
    for_each<__gnu_cxx::__normal_iterator<Assimp::FBX::Token_const**,std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>>,Assimp::FBX::Util::delete_fun<Assimp::FBX::Token>>
              (local_1e8.
               super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_1e8.
               super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    FBX::Document::~Document(&local_180);
    FBX::Parser::~Parser(&local_1b0);
    if (local_1e8.
        super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.
                      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    (**(code **)(*plVar3 + 8))(plVar3);
    return;
  }
  __assert_fail("globals.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.h"
                ,0x44d,"const FileGlobalSettings &Assimp::FBX::Document::GlobalSettings() const");
}

Assistant:

void FBXImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> stream(pIOHandler->Open(pFile,"rb"));
    if (!stream) {
        ThrowException("Could not open file for reading");
    }

    // read entire file into memory - no streaming for this, fbx
    // files can grow large, but the assimp output data structure
    // then becomes very large, too. Assimp doesn't support
    // streaming for its output data structures so the net win with
    // streaming input data would be very low.
    std::vector<char> contents;
    contents.resize(stream->FileSize()+1);
    stream->Read( &*contents.begin(), 1, contents.size()-1 );
    contents[ contents.size() - 1 ] = 0;
    const char* const begin = &*contents.begin();

    // broadphase tokenizing pass in which we identify the core
    // syntax elements of FBX (brackets, commas, key:value mappings)
    TokenList tokens;
    try {

        bool is_binary = false;
        if (!strncmp(begin,"Kaydara FBX Binary",18)) {
            is_binary = true;
            TokenizeBinary(tokens,begin,contents.size());
        }
        else {
            Tokenize(tokens,begin);
        }

        // use this information to construct a very rudimentary
        // parse-tree representing the FBX scope structure
        Parser parser(tokens, is_binary);

        // take the raw parse-tree and convert it to a FBX DOM
        Document doc(parser,settings);

        // convert the FBX DOM to aiScene
        ConvertToAssimpScene(pScene, doc, settings.removeEmptyBones);

        // size relative to cm
        float size_relative_to_cm = doc.GlobalSettings().UnitScaleFactor();

        // Set FBX file scale is relative to CM must be converted to M for
        // assimp universal format (M)
        SetFileScale( size_relative_to_cm * 0.01f);

        std::for_each(tokens.begin(),tokens.end(),Util::delete_fun<Token>());
    }
    catch(std::exception&) {
        std::for_each(tokens.begin(),tokens.end(),Util::delete_fun<Token>());
        throw;
    }
}